

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

bool __thiscall ByteCodeGenerator::DoJitLoopBodies(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseableFunctionInfo *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = Js::ParseableFunctionInfo::IsFunctionParsed(funcInfo->byteCodeFunction);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x7c3,"(funcInfo->byteCodeFunction->IsFunctionParsed())",
                       "funcInfo->byteCodeFunction->IsFunctionParsed()");
    if (!bVar2) goto LAB_0082444b;
    *puVar3 = 0;
  }
  this_00 = funcInfo->byteCodeFunction;
  bVar2 = Js::FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar2) {
LAB_0082444b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Js::FunctionProxy::IsJitLoopBodyPhaseForced(&this_00->super_FunctionProxy);
  if ((bVar2) && ((this_00->flags & Flags_HasTry) == Flags_None)) {
    return true;
  }
  bVar2 = Js::FunctionProxy::IsJitLoopBodyPhaseEnabled
                    (&funcInfo->byteCodeFunction->super_FunctionProxy);
  return bVar2;
}

Assistant:

bool ByteCodeGenerator::DoJitLoopBodies(FuncInfo *funcInfo) const
{
    // Never JIT loop bodies in a function with a try.
    // Otherwise, always JIT loop bodies under /forcejitloopbody.
    // Otherwise, JIT loop bodies unless we're in eval/"new Function" or feature is disabled.

    Assert(funcInfo->byteCodeFunction->IsFunctionParsed());
    Js::FunctionBody* functionBody = funcInfo->byteCodeFunction->GetFunctionBody();

    return functionBody->ForceJITLoopBody() || funcInfo->byteCodeFunction->IsJitLoopBodyPhaseEnabled();
}